

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O2

void __thiscall OPL_RDOSdump::WriteDelay(OPL_RDOSdump *this,int ticks)

{
  int iVar1;
  BYTE delay [2];
  
  if (0 < ticks) {
    delay[1] = '\0';
    for (iVar1 = ticks * (this->super_OPLDump).TickMul; 0xff < iVar1; iVar1 = iVar1 + -0xff) {
      delay[0] = 0xff;
      fwrite(delay,1,2,(FILE *)(this->super_OPLDump).File);
    }
    delay[0] = (BYTE)iVar1;
    fwrite(delay,1,2,(FILE *)(this->super_OPLDump).File);
  }
  return;
}

Assistant:

virtual void WriteDelay(int ticks)
	{
		if (ticks > 0)
		{ // RDos raw has very precise delays but isn't very efficient at
		  // storing long delays.
			BYTE delay[2];

			ticks *= TickMul;
			delay[1] = 0;
			while (ticks > 255)
			{
				ticks -= 255;
				delay[0] = 255;
				fwrite(delay, 1, 2, File);
			}
			delay[0] = BYTE(ticks);
			fwrite(delay, 1, 2, File);
		}
	}